

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O0

void TTD::NSLogEvents::JsRTRawBufferModifyAction_Parse<(TTD::NSLogEvents::EventKind)65>
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  uint32 uVar1;
  int iVar2;
  JsRTRawBufferModifyAction *pJVar3;
  TTDVar pvVar4;
  FileReader *reader_00;
  byte *local_40;
  uint local_34;
  uint32 i;
  JsRTRawBufferModifyAction *bufferAction;
  UnlinkableSlabAllocator *alloc_local;
  FileReader *reader_local;
  ThreadContext *threadContext_local;
  EventLogEntry *evt_local;
  
  pJVar3 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTRawBufferModifyAction,(TTD::NSLogEvents::EventKind)65>
                     (evt);
  (*reader->_vptr_FileReader[3])(reader,0x12,1);
  pvVar4 = NSSnapValues::ParseTTDVar((NSSnapValues *)0x0,SUB81(reader,0),reader_00);
  pJVar3->Trgt = pvVar4;
  uVar1 = FileReader::ReadUInt32(reader,index,true);
  pJVar3->Index = uVar1;
  uVar1 = FileReader::ReadUInt32(reader,count,true);
  pJVar3->Length = uVar1;
  if (pJVar3->Length == 0) {
    local_40 = (byte *)0x0;
  }
  else {
    local_40 = SlabAllocatorBase<8>::SlabAllocateArray<unsigned_char>(alloc,(ulong)pJVar3->Length);
  }
  pJVar3->Data = local_40;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  for (local_34 = 0; local_34 < pJVar3->Length; local_34 = local_34 + 1) {
    iVar2 = (*reader->_vptr_FileReader[9])(reader,(ulong)(local_34 != 0));
    pJVar3->Data[local_34] = (byte)iVar2;
  }
  (*reader->_vptr_FileReader[5])();
  return;
}

Assistant:

void JsRTRawBufferModifyAction_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTRawBufferModifyAction* bufferAction = GetInlineEventDataAs<JsRTRawBufferModifyAction, tag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            bufferAction->Trgt = NSSnapValues::ParseTTDVar(false, reader);

            bufferAction->Index = reader->ReadUInt32(NSTokens::Key::index, true);
            bufferAction->Length = reader->ReadUInt32(NSTokens::Key::count, true);

            bufferAction->Data = (bufferAction->Length != 0) ? alloc.SlabAllocateArray<byte>(bufferAction->Length) : nullptr;

            reader->ReadSequenceStart_WDefaultKey(true);
            for(uint32 i = 0; i < bufferAction->Length; ++i)
            {
                bufferAction->Data[i] = reader->ReadNakedByte(i != 0);
            }
            reader->ReadSequenceEnd();
        }